

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

int __thiscall section_data::push_intercept(section_data *this,int *layer,intercept_data intercept)

{
  iterator __position;
  vector<intercept_data,std::allocator<intercept_data>> *this_00;
  intercept_data local_10;
  
  local_10.dist = intercept.dist;
  local_10._0_8_ = intercept._0_8_;
  this_00 = (vector<intercept_data,std::allocator<intercept_data>> *)
            std::
            map<int,_std::vector<intercept_data,_std::allocator<intercept_data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>_>
            ::operator[](&this->layer_intercepts,layer);
  __position._M_current = *(intercept_data **)(this_00 + 8);
  if (__position._M_current == *(intercept_data **)(this_00 + 0x10)) {
    std::vector<intercept_data,std::allocator<intercept_data>>::
    _M_realloc_insert<intercept_data_const&>(this_00,__position,&local_10);
  }
  else {
    (__position._M_current)->dist = local_10.dist;
    (__position._M_current)->x = local_10.x;
    (__position._M_current)->y = local_10.y;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xc;
  }
  return 0;
}

Assistant:

int section_data::push_intercept(int &layer, intercept_data intercept)
{
  // map<int, vector<double>> layer_intercepts
  // key = layer number
  layer_intercepts[layer].push_back(intercept);
  return EXIT_SUCCESS;
}